

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall ChainstateManager::NotifyHeaderTip(ChainstateManager *this)

{
  long lVar1;
  CBlockIndex *pCVar2;
  CBlockIndex *pCVar3;
  Notifications *pNVar4;
  bool bVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock19,&cs_main,"GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0xd4e,false);
  pCVar2 = this->m_best_header;
  pCVar3 = this->m_last_notified_header;
  if (pCVar2 != pCVar3) {
    bVar5 = IsInitialBlockDownload(this);
    this->m_last_notified_header = pCVar2;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  if (pCVar2 != pCVar3) {
    pNVar4 = (this->m_options).notifications;
    uVar6 = 2;
    if (bVar5 != false) {
      uVar6 = (ulong)((this->m_blockman).m_blockfiles_indexed._M_base._M_i & 1);
    }
    (*pNVar4->_vptr_Notifications[3])(pNVar4,uVar6,(long)pCVar2->nHeight,(ulong)pCVar2->nTime,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar2 != pCVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::NotifyHeaderTip()
{
    bool fNotify = false;
    bool fInitialBlockDownload = false;
    CBlockIndex* pindexHeader = nullptr;
    {
        LOCK(GetMutex());
        pindexHeader = m_best_header;

        if (pindexHeader != m_last_notified_header) {
            fNotify = true;
            fInitialBlockDownload = IsInitialBlockDownload();
            m_last_notified_header = pindexHeader;
        }
    }
    // Send block tip changed notifications without the lock held
    if (fNotify) {
        GetNotifications().headerTip(GetSynchronizationState(fInitialBlockDownload, m_blockman.m_blockfiles_indexed), pindexHeader->nHeight, pindexHeader->nTime, false);
    }
    return fNotify;
}